

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O2

void Rnm_ManCollect(Rnm_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar4;
  uint i;
  Gia_Man_t *pGVar5;
  
  Gia_ManIncrementTravId(p->pGia);
  pGVar4 = p->pGia->pObjs;
  Gia_ObjSetTravIdCurrent(p->pGia,pGVar4);
  pGVar5 = p->pGia;
  pGVar5->pObjs->Value = 0;
  pObj = (Gia_Obj_t *)0x0;
  i = 0;
  do {
    iVar1 = (int)pGVar4;
    if (p->vMap->nSize <= (int)i) {
LAB_004fdfca:
      p->vObjs->nSize = 0;
      pGVar4 = Gia_ManPo(pGVar5,iVar1);
      Rnm_ManCollect_rec(pGVar5,pGVar4,p->vObjs,p->vMap->nSize + 1);
      iVar1 = 0;
      while( true ) {
        iVar3 = p->vObjs->nSize;
        if (iVar3 <= iVar1) break;
        pGVar5 = p->pGia;
        iVar3 = Vec_IntEntry(p->vObjs,iVar1);
        pObj = Gia_ManObj(pGVar5,iVar3);
        iVar3 = Gia_ObjIsRo(p->pGia,pObj);
        if (iVar3 != 0) {
          pGVar5 = p->pGia;
          pGVar4 = Gia_ObjRoToRi(pGVar5,pObj);
          Rnm_ManCollect_rec(pGVar5,pGVar4,p->vObjs,p->vMap->nSize + 1);
        }
        iVar1 = iVar1 + 1;
      }
      if (((int)(uint)*(undefined8 *)pObj < 0) &&
         (((uint)*(undefined8 *)pObj & 0x1fffffff) != 0x1fffffff)) {
        if (pObj->Value == iVar3 + p->vMap->nSize) {
          return;
        }
        __assert_fail("(int)pObj->Value == Vec_IntSize(p->vMap) + Vec_IntSize(p->vObjs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRef.c"
                      ,0x175,"void Rnm_ManCollect(Rnm_Man_t *)");
      }
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRef.c"
                    ,0x174,"void Rnm_ManCollect(Rnm_Man_t *)");
    }
    iVar1 = Vec_IntEntry(p->vMap,i);
    pObj = Gia_ManObj(pGVar5,iVar1);
    if (pObj == (Gia_Obj_t *)0x0) {
      pGVar5 = p->pGia;
      pObj = (Gia_Obj_t *)0x0;
      goto LAB_004fdfca;
    }
    uVar2 = (uint)*(undefined8 *)pObj;
    if (((~uVar2 & 0x9fffffff) != 0) && (((int)uVar2 < 0 || ((uVar2 & 0x1fffffff) == 0x1fffffff))))
    {
      __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRef.c"
                    ,0x169,"void Rnm_ManCollect(Rnm_Man_t *)");
    }
    pGVar4 = pObj;
    Gia_ObjSetTravIdCurrent(p->pGia,pObj);
    i = i + 1;
    pObj->Value = i;
    pGVar5 = p->pGia;
  } while( true );
}

Assistant:

void Rnm_ManCollect( Rnm_Man_t * p )
{
    Gia_Obj_t * pObj = NULL;
    int i;
    // mark const/PIs/PPIs
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrent( p->pGia, Gia_ManConst0(p->pGia) );
    Gia_ManConst0(p->pGia)->Value = 0;
    Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
    {
        assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
        Gia_ObjSetTravIdCurrent( p->pGia, pObj );
        pObj->Value = 1 + i;
    }
    // collect objects
    Vec_IntClear( p->vObjs );
    Rnm_ManCollect_rec( p->pGia, Gia_ManPo(p->pGia, 0), p->vObjs, 1 + Vec_IntSize(p->vMap) );
    Gia_ManForEachObjVec( p->vObjs, p->pGia, pObj, i )
        if ( Gia_ObjIsRo(p->pGia, pObj) )
            Rnm_ManCollect_rec( p->pGia, Gia_ObjRoToRi(p->pGia, pObj), p->vObjs, 1 + Vec_IntSize(p->vMap) );
    // the last object should be a CO
    assert( Gia_ObjIsCo(pObj) );
    assert( (int)pObj->Value == Vec_IntSize(p->vMap) + Vec_IntSize(p->vObjs) );
}